

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O0

Result __thiscall
wabt::WastParser::ParseLoadStoreInstr<wabt::LoadStoreExpr<(wabt::ExprType)3>>
          (WastParser *this,Location loc,Token token,
          unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *out_expr)

{
  bool bVar1;
  LoadStoreExpr<(wabt::ExprType)3> *this_00;
  Var local_f8;
  Opcode local_b0;
  undefined4 local_ac;
  size_t local_a8;
  char *local_a0;
  size_t local_98;
  undefined8 local_90;
  Enum local_84;
  Address local_80;
  Address align;
  Address offset;
  Var memidx;
  Opcode opcode;
  unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *out_expr_local;
  WastParser *this_local;
  
  memidx.field_2._28_4_ = Token::opcode(&token);
  Var::Var((Var *)&offset);
  local_a8 = loc.filename._M_len;
  local_a0 = loc.filename._M_str;
  local_98 = (size_t)loc.field_1.field_1.offset;
  local_90 = loc.field_1._8_8_;
  local_84 = (Enum)ParseMemidx(this,loc,(Var *)&offset);
  bVar1 = Failed((Result)local_84);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    ParseOffsetOpt(this,&align);
    ParseAlignOpt(this,&local_80);
    this_00 = (LoadStoreExpr<(wabt::ExprType)3> *)operator_new(0xa0);
    local_b0.enum_ = memidx.field_2._28_4_;
    Var::Var(&local_f8,(Var *)&offset);
    LoadStoreExpr<(wabt::ExprType)3>::LoadStoreExpr(this_00,local_b0,&local_f8,local_80,align,&loc);
    std::unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_>::reset(out_expr,(pointer)this_00);
    Var::~Var(&local_f8);
    Result::Result((Result *)((long)&this_local + 4),Ok);
  }
  local_ac = 1;
  Var::~Var((Var *)&offset);
  return (Result)this_local._4_4_;
}

Assistant:

Result WastParser::ParseLoadStoreInstr(Location loc,
                                       Token token,
                                       std::unique_ptr<Expr>* out_expr) {
  Opcode opcode = token.opcode();
  Var memidx;
  Address offset;
  Address align;
  CHECK_RESULT(ParseMemidx(loc, &memidx));
  ParseOffsetOpt(&offset);
  ParseAlignOpt(&align);
  out_expr->reset(new T(opcode, memidx, align, offset, loc));
  return Result::Ok;
}